

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RecordSet::RecordSet
          (RecordSet *this,RecordID ID,KUINT32 SerialNum,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *RecordValue,KUINT16 RecordCount)

{
  KUINT16 RecordCount_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *RecordValue_local;
  KUINT32 SerialNum_local;
  RecordID ID_local;
  RecordSet *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RecordSet_0032f260;
  this->m_ui32RecID = ID;
  this->m_ui32RecSetSerialNum = SerialNum;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vui8RecVals);
  SetRecordValues(this,RecordValue,RecordCount);
  return;
}

Assistant:

RecordSet::RecordSet( RecordID ID, KUINT32 SerialNum, const vector<KUINT8> & RecordValue,
                      KUINT16 RecordCount ) :
    m_ui32RecID( ID ),
    m_ui32RecSetSerialNum( SerialNum )
{
    SetRecordValues( RecordValue, RecordCount );
}